

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  flat_hash_map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *this_00;
  byte bVar1;
  long lVar2;
  MessageSCCAnalyzer *this_01;
  bool bVar3;
  char cVar4;
  FileOptions_OptimizeMode FVar5;
  int iVar6;
  MessageAnalysis MVar7;
  Descriptor *pDVar8;
  SCC *pSVar9;
  bool bVar10;
  pointer ppDVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  iterator it;
  bool local_88;
  SCC *local_80;
  Descriptor *local_78;
  flat_hash_map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *local_70;
  ulong local_68;
  MessageSCCAnalyzer *local_60;
  iterator local_58;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>::iterator,_bool>
  local_48;
  
  this_00 = &this->analysis_cache_;
  local_80 = scc;
  local_58 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
             ::find<google::protobuf::compiler::SCC_const*>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                         *)this_00,&local_80);
  local_48.first.ctrl_ = (ctrl_t *)0x0;
  bVar3 = absl::lts_20240722::container_internal::operator==(&local_58,&local_48.first);
  if (bVar3) {
    if ((this->options_).lite_implicit_weak_fields == true) {
      FVar5 = GetOptimizeFor(*(FileDescriptor **)
                              (*(local_80->descriptors).
                                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x10),&this->options_,
                             (bool *)0x0);
      bVar3 = FVar5 == FileOptions_OptimizeMode_LITE_RUNTIME;
    }
    else {
      bVar3 = false;
    }
    ppDVar11 = (local_80->descriptors).
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_70 = this_00;
    if ((local_80->descriptors).
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppDVar11) {
      local_88 = false;
      bVar10 = false;
      bVar12 = false;
      bVar13 = false;
    }
    else {
      uVar14 = 0;
      bVar13 = false;
      bVar12 = false;
      bVar10 = false;
      local_88 = false;
      pSVar9 = local_80;
      local_60 = this;
      do {
        pDVar8 = ppDVar11[uVar14];
        if (0 < *(int *)(pDVar8 + 0x88)) {
          bVar12 = true;
        }
        if (0 < *(int *)(pDVar8 + 4)) {
          lVar15 = 0;
          lVar16 = 0;
          local_78 = pDVar8;
          local_68 = uVar14;
          do {
            lVar2 = *(long *)(local_78 + 0x38);
            cVar4 = google::protobuf::FieldDescriptor::is_required();
            if (cVar4 != '\0') {
              bVar13 = true;
            }
            if (*(char *)(*(long *)(lVar2 + 0x38 + lVar15) + 0x8c) != '\0') {
              bVar3 = true;
            }
            bVar1 = *(byte *)(lVar2 + 2 + lVar15);
            if (bVar1 - 10 < 2) {
              pDVar8 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
              this_01 = local_60;
              pSVar9 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>
                       ::GetSCC(&local_60->analyzer_,pDVar8);
              if (pSVar9 == local_80) {
                local_88 = true;
              }
              else {
                MVar7 = GetSCCAnalysis(this_01,pSVar9);
                bVar10 = (bool)(MVar7.contains_cord & 1U | bVar10);
                bVar12 = (bool)(MVar7.contains_extension & 1U | bVar12);
                bVar13 = (bool)(MVar7.contains_required & 1U | bVar13);
                bVar3 = (bool)(MVar7.contains_weak & 1U | bVar3);
              }
            }
            else if (((bVar1 == 0xc) || (bVar1 == 9)) &&
                    (iVar6 = google::protobuf::FieldDescriptor::cpp_string_type(), iVar6 == 2)) {
              bVar10 = true;
            }
            lVar16 = lVar16 + 1;
            lVar15 = lVar15 + 0x58;
          } while (lVar16 < *(int *)(local_78 + 4));
          ppDVar11 = (local_80->descriptors).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pSVar9 = local_80;
          uVar14 = local_68;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)(pSVar9->descriptors).
                                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar11 >>
                               3));
    }
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
    ::try_emplace_impl<google::protobuf::compiler::SCC_const*const&>(&local_48,local_70,&local_80);
    ((MessageAnalysis *)((long)local_48.first.field_1.slot_ + 8))->is_recursive = local_88;
    *(bool *)((long)local_48.first.field_1.slot_ + 9) = bVar10;
    *(bool *)((long)local_48.first.field_1.slot_ + 10) = bVar12;
    *(bool *)((long)local_48.first.field_1.slot_ + 0xb) = bVar13;
    *(bool *)((long)local_48.first.field_1.slot_ + 0xc) = bVar3;
  }
  else {
    local_48.first.field_1.slot_ =
         (slot_type *)
         absl::lts_20240722::container_internal::
         raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
         ::iterator::operator->(&local_58);
  }
  return *(MessageAnalysis *)((long)local_48.first.field_1.slot_ + 8);
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  auto it = analysis_cache_.find(scc);
  if (it != analysis_cache_.end()) return it->second;

  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (size_t i = 0; i < scc->descriptors.size(); ++i) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->cpp_string_type() ==
              FieldDescriptor::CppStringType::kCord) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = std::move(result);
}